

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest_main.cc
# Opt level: O1

void gflags::anon_unknown_5::Test_FlagsSetBeforeInitTest_TryFromEnv::Run(void)

{
  int iVar1;
  FlagSaver fs;
  
  FlagSaver::FlagSaver(&fs);
  fprintf(_stderr,"Running test %s/%s\n","FlagsSetBeforeInitTest","TryFromEnv");
  iVar1 = std::__cxx11::string::compare(fLS::FLAGS_test_tryfromenv_abi_cxx11_);
  if (iVar1 == 0) {
    FlagSaver::~FlagSaver(&fs);
    return;
  }
  fprintf(_stderr,"Check failed: %s %s %s\n","\"pre-set\"","==","FLAGS_test_tryfromenv");
  exit(1);
}

Assistant:

TEST(FlagsSetBeforeInitTest, TryFromEnv) {
  EXPECT_EQ("pre-set", FLAGS_test_tryfromenv);
}